

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

SVInt __thiscall slang::SVInt::lshr(SVInt *this,bitwidth_t amount)

{
  uint64_t *puVar1;
  uint64_t *puVar2;
  ulong uVar3;
  byte bVar4;
  bool isSigned;
  uint in_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  uint64_t value;
  undefined8 extraout_RDX_01;
  undefined8 uVar5;
  undefined4 in_register_00000034;
  SVIntStorage *other;
  ulong uVar6;
  uint uVar7;
  SVInt SVar8;
  
  other = (SVIntStorage *)CONCAT44(in_register_00000034,amount);
  if (in_EDX == 0) {
    SVInt(this,other);
    uVar5 = extraout_RDX_00;
  }
  else {
    uVar7 = other->bitWidth;
    if (in_EDX < uVar7) {
      bVar4 = (byte)in_EDX;
      if (0x40 < uVar7 || (other->unknownFlag & 1U) != 0) {
        allocZeroed(this,uVar7,other->signFlag,(bool)(other->unknownFlag & 1));
        if ((in_EDX < 0x40) && (other->unknownFlag == false)) {
          puVar1 = (this->super_SVIntStorage).field_0.pVal;
          puVar2 = (other->field_0).pVal;
          uVar7 = other->bitWidth + 0x3f >> 6;
          uVar6 = 0;
          while( true ) {
            uVar7 = uVar7 - 1;
            if ((int)uVar7 < 0) break;
            uVar3 = puVar2[uVar7 & 0x7fffffff];
            puVar1[uVar7 & 0x7fffffff] = uVar3 >> (bVar4 & 0x3f) | uVar6;
            uVar6 = uVar3 << (0x40 - bVar4 & 0x3f);
          }
        }
        else {
          uVar7 = other->bitWidth + 0x3f >> 6;
          lshrFar((this->super_SVIntStorage).field_0.pVal,(other->field_0).pVal,in_EDX & 0x3f,
                  in_EDX >> 6,0,uVar7);
          if (other->unknownFlag == true) {
            lshrFar((this->super_SVIntStorage).field_0.pVal,(other->field_0).pVal,in_EDX & 0x3f,
                    in_EDX >> 6,uVar7,uVar7);
          }
        }
        checkUnknown(this);
        uVar5 = extraout_RDX;
        goto LAB_002552a5;
      }
      value = (other->field_0).val >> (bVar4 & 0x3f);
      isSigned = other->signFlag;
    }
    else {
      isSigned = other->signFlag;
      value = 0;
    }
    SVInt(this,uVar7,value,isSigned);
    uVar5 = extraout_RDX_01;
  }
LAB_002552a5:
  SVar8.super_SVIntStorage.bitWidth = (int)uVar5;
  SVar8.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar5 >> 0x20);
  SVar8.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar5 >> 0x28);
  SVar8.super_SVIntStorage._14_2_ = (short)((ulong)uVar5 >> 0x30);
  SVar8.super_SVIntStorage.field_0.pVal = (uint64_t *)this;
  return (SVInt)SVar8.super_SVIntStorage;
}

Assistant:

SVInt SVInt::lshr(bitwidth_t amount) const {
    // handle trivial cases
    if (amount == 0)
        return *this;
    if (amount >= bitWidth) // if the shift amount is too large, we end up with zero anyway
        return SVInt(bitWidth, 0, signFlag);
    if (isSingleWord())
        return SVInt(bitWidth, val >> amount, signFlag);

    // handle the small shift case
    SVInt result = allocZeroed(bitWidth, signFlag, unknownFlag);
    if (amount < BITS_PER_WORD && !unknownFlag)
        lshrNear(result.pVal, pVal, getNumWords(), amount);
    else {
        // otherwise do a full shift
        uint32_t numWords = getNumWords(bitWidth, false);
        uint32_t wordShift = amount % BITS_PER_WORD;
        uint32_t offset = amount / BITS_PER_WORD;

        // also handle shifting the unknown bits if necessary
        lshrFar(result.pVal, pVal, wordShift, offset, 0, numWords);
        if (unknownFlag)
            lshrFar(result.pVal, pVal, wordShift, offset, numWords, numWords);
    }

    result.checkUnknown();
    return result;
}